

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutualInformation.cpp
# Opt level: O2

void __thiscall MutualInformation::~MutualInformation(MutualInformation *this)

{
  ~MutualInformation(this);
  operator_delete(this);
  return;
}

Assistant:

MutualInformation::~MutualInformation()
{
}